

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O3

void ZopfliResetHash(size_t window_size,ZopfliHash *h)

{
  unsigned_short *puVar1;
  int *piVar2;
  size_t sVar3;
  
  h->val = 0;
  memset(h->head,0xff,0x40000);
  if (window_size != 0) {
    puVar1 = h->prev;
    piVar2 = h->hashval;
    sVar3 = 0;
    do {
      puVar1[sVar3] = (unsigned_short)sVar3;
      piVar2[sVar3] = -1;
      sVar3 = sVar3 + 1;
    } while (window_size != sVar3);
    sVar3 = 0;
    memset(h->same,0,window_size * 2);
    h->val2 = 0;
    memset(h->head2,0xff,0x40000);
    puVar1 = h->prev2;
    piVar2 = h->hashval2;
    do {
      puVar1[sVar3] = (unsigned_short)sVar3;
      piVar2[sVar3] = -1;
      sVar3 = sVar3 + 1;
    } while (window_size != sVar3);
    return;
  }
  h->val2 = 0;
  memset(h->head2,0xff,0x40000);
  return;
}

Assistant:

void ZopfliResetHash(size_t window_size, ZopfliHash* h) {
  size_t i;

  h->val = 0;
  for (i = 0; i < 65536; i++) {
    h->head[i] = -1;  /* -1 indicates no head so far. */
  }
  for (i = 0; i < window_size; i++) {
    h->prev[i] = i;  /* If prev[j] == j, then prev[j] is uninitialized. */
    h->hashval[i] = -1;
  }

#ifdef ZOPFLI_HASH_SAME
  for (i = 0; i < window_size; i++) {
    h->same[i] = 0;
  }
#endif

#ifdef ZOPFLI_HASH_SAME_HASH
  h->val2 = 0;
  for (i = 0; i < 65536; i++) {
    h->head2[i] = -1;
  }
  for (i = 0; i < window_size; i++) {
    h->prev2[i] = i;
    h->hashval2[i] = -1;
  }
#endif
}